

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O1

string * __thiscall
TreeIncPruneBGPlanner::SoftPrintJpol_abi_cxx11_
          (string *__return_storage_ptr__,TreeIncPruneBGPlanner *this,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *jpol)

{
  pointer pvVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((jpol->
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (jpol->
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      pvVar1 = (jpol->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar2 = pvVar1[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar1[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 8) != puVar2) {
        uVar3 = 0;
        uVar5 = 1;
        do {
          if (puVar2[uVar3] == 0xffffffff) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"U",1);
          }
          else {
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          }
          pvVar1 = (jpol->
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          puVar2 = pvVar1[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          bVar6 = (long)*(pointer *)
                         ((long)&pvVar1[uVar4].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data + 8) - (long)puVar2 >> 2 != uVar5;
          uVar3 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (((long)(jpol->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(jpol->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - uVar4
             != 0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string TreeIncPruneBGPlanner::SoftPrintJpol(
    const vector<vector<Index> > &jpol) const
{
    stringstream ss;
    for(Index k=0;k!=jpol.size();++k)
    {
        ss << "[";
        for(Index o=0;o!=jpol[k].size();++o)
        {
            if(jpol[k][o]==UNSPECIFIED_ACTION)
                ss << "U";
            else
                ss << jpol[k][o];
        }
        ss << "]";
    }
    
    return(ss.str());
}